

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> * __thiscall
llvm::yaml::Input::keys
          (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__return_storage_ptr__,
          Input *this)

{
  HNode *hnode;
  bool bVar1;
  NameToNode *this_00;
  StringRef SVar2;
  StringRef local_80;
  StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
  *local_70;
  StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
  *P;
  iterator __end1;
  iterator __begin1;
  NameToNode *__range1;
  Twine local_40;
  undefined1 local_21;
  ret_type local_20;
  MapHNode *MN;
  Input *this_local;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Ret;
  
  MN = (MapHNode *)this;
  this_local = (Input *)__return_storage_ptr__;
  local_20 = dyn_cast<llvm::yaml::Input::MapHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
  local_21 = 0;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector(__return_storage_ptr__);
  if (local_20 == (ret_type)0x0) {
    hnode = this->CurrentNode;
    Twine::Twine(&local_40,"not a mapping");
    setError(this,hnode,&local_40);
  }
  else {
    this_00 = &local_20->Mapping;
    __end1 = StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
             ::begin(this_00);
    P = (StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
         *)StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
           ::end(this_00);
    while( true ) {
      bVar1 = iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_&>
              ::operator!=((iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_&>
                            *)&__end1,
                           (StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
                            *)&P);
      if (!bVar1) break;
      local_70 = StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
                 ::operator*(&__end1);
      SVar2 = StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
              ::first(local_70);
      local_80 = SVar2;
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
                (__return_storage_ptr__,&local_80);
      StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
      ::operator++(&__end1.
                    super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                  );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> Input::keys() {
  MapHNode *MN = dyn_cast<MapHNode>(CurrentNode);
  std::vector<StringRef> Ret;
  if (!MN) {
    setError(CurrentNode, "not a mapping");
    return Ret;
  }
  for (auto &P : MN->Mapping)
    Ret.push_back(P.first());
  return Ret;
}